

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O0

int CCharmap::name_is_ascii_synonym(char *table_name)

{
  int iVar1;
  char *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar2;
  
  iVar1 = stricmp((char *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
                  in_stack_ffffffffffffffe8);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    bVar2 = true;
    if (iVar1 != 0) {
      iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
      bVar2 = true;
      if (iVar1 != 0) {
        iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
        bVar2 = true;
        if (iVar1 != 0) {
          iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
          bVar2 = true;
          if (iVar1 != 0) {
            iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8)
            ;
            bVar2 = true;
            if (iVar1 != 0) {
              iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),
                              in_stack_ffffffffffffffe8);
              bVar2 = iVar1 == 0;
            }
          }
        }
      }
    }
  }
  return (int)bVar2;
}

Assistant:

static int name_is_ascii_synonym(const char *table_name)
    {
        /* accept any of the various synonyms for ASCII */
        return (stricmp(table_name, "us-ascii") == 0
                || stricmp(table_name, "asc7dflt") == 0
                || stricmp(table_name, "ascii") == 0
                || stricmp(table_name, "iso646-us") == 0
                || stricmp(table_name, "iso-ir-6") == 0
                || stricmp(table_name, "cp367") == 0
                || stricmp(table_name, "us") == 0);
    }